

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

tuple<unsigned_short,_TileData::MatchType> __thiscall
optimized::UniqueTiles::addTile(UniqueTiles *this,Tile *tile,Palette *palette)

{
  size_type sVar1;
  pointer pTVar2;
  Palette *in_RCX;
  pair<std::__detail::_Node_iterator<TileData,_true,_true>,_bool> pVar3;
  reference local_80;
  MatchType local_74;
  type *ptStack_70;
  MatchType matchType;
  type *inserted;
  type *tileData;
  undefined1 local_58;
  pair<std::__detail::_Node_iterator<TileData,_true,_true>,_bool> local_50;
  undefined1 local_3c [8];
  TileData newTile;
  Palette *palette_local;
  Tile *tile_local;
  UniqueTiles *this_local;
  
  TileData::TileData((TileData *)local_3c,(Tile *)palette,in_RCX);
  pVar3 = std::
          unordered_set<TileData,_std::hash<TileData>,_std::equal_to<TileData>,_std::allocator<TileData>_>
          ::insert((unordered_set<TileData,_std::hash<TileData>,_std::equal_to<TileData>,_std::allocator<TileData>_>
                    *)tile,(TileData *)local_3c);
  tileData = (type *)pVar3.first.super__Node_iterator_base<TileData,_true>._M_cur;
  local_58 = pVar3.second;
  local_50.first.super__Node_iterator_base<TileData,_true>._M_cur =
       (_Node_iterator_base<TileData,_true>)(_Node_iterator_base<TileData,_true>)tileData;
  local_50.second = (bool)local_58;
  inserted = (type *)std::get<0ul,std::__detail::_Node_iterator<TileData,true,true>,bool>(&local_50)
  ;
  ptStack_70 = std::get<1ul,std::__detail::_Node_iterator<TileData,true,true>,bool>(&local_50);
  local_74 = EXACT;
  if ((*ptStack_70 & 1U) == 0) {
    pTVar2 = std::__detail::_Node_iterator<TileData,_true,_true>::operator->
                       ((_Node_iterator<TileData,_true,_true> *)inserted);
    local_74 = TileData::tryMatching(pTVar2,(TileData *)local_3c);
  }
  else {
    sVar1 = std::vector<const_TileData_*,_std::allocator<const_TileData_*>_>::size
                      ((vector<const_TileData_*,_std::allocator<const_TileData_*>_> *)&tile[3].x);
    pTVar2 = std::__detail::_Node_iterator<TileData,_true,_true>::operator->
                       ((_Node_iterator<TileData,_true,_true> *)inserted);
    pTVar2->tileID = (uint16_t)sVar1;
    local_80 = std::__detail::_Node_iterator<TileData,_true,_true>::operator*
                         ((_Node_iterator<TileData,_true,_true> *)inserted);
    std::vector<TileData_const*,std::allocator<TileData_const*>>::emplace_back<TileData_const*>
              ((vector<TileData_const*,std::allocator<TileData_const*>> *)&tile[3].x,&local_80);
  }
  pTVar2 = std::__detail::_Node_iterator<TileData,_true,_true>::operator->
                     ((_Node_iterator<TileData,_true,_true> *)inserted);
  std::tuple<unsigned_short,_TileData::MatchType>::
  tuple<unsigned_short_&,_TileData::MatchType_&,_true>
            ((tuple<unsigned_short,_TileData::MatchType> *)this,&pTVar2->tileID,&local_74);
  return (tuple<unsigned_short,_TileData::MatchType>)
         (_Tuple_impl<0UL,_unsigned_short,_TileData::MatchType>)this;
}

Assistant:

std::tuple<uint16_t, TileData::MatchType> addTile(Png::TilesVisitor::Tile const &tile,
	                                                  Palette const &palette) {
		TileData newTile(tile, palette);
		auto [tileData, inserted] = tileset.insert(newTile);

		TileData::MatchType matchType = TileData::EXACT;
		if (inserted) {
			// Give the new tile the next available unique ID
			tileData->tileID = static_cast<uint16_t>(tiles.size());
			// Pointers are never invalidated!
			tiles.emplace_back(&*tileData);
		} else {
			matchType = tileData->tryMatching(newTile);
		}
		return {tileData->tileID, matchType};
	}